

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  uint uVar2;
  stbi__context *s;
  byte bVar3;
  uint uVar4;
  int iVar5;
  stbi__uint32 sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  stbi_uc *psVar10;
  byte *pbVar11;
  void *pvVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  char *pcVar22;
  int *piVar23;
  bool bVar24;
  
  s = z->s;
  uVar4 = stbi__get16be(s);
  pcVar22 = "Corrupt JPEG";
  if (uVar4 < 0xb) {
    stbi__g_failure_reason = pcVar22;
    return 0;
  }
  psVar10 = s->img_buffer;
  if (s->img_buffer_end <= psVar10) {
    if (s->read_from_callbacks == 0) goto LAB_00112daf;
    psVar10 = s->buffer_start;
    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
    if (iVar5 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar10;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar10;
      s->img_buffer_end = psVar10 + iVar5;
    }
    psVar10 = s->img_buffer;
  }
  s->img_buffer = psVar10 + 1;
  if (*psVar10 != '\b') {
LAB_00112daf:
    stbi__g_failure_reason = "JPEG format not supported: 8-bit only";
    return 0;
  }
  sVar6 = stbi__get16be(s);
  s->img_y = sVar6;
  if (sVar6 == 0) {
    stbi__g_failure_reason = "JPEG format not supported: delayed height";
    return 0;
  }
  sVar6 = stbi__get16be(s);
  s->img_x = sVar6;
  if (sVar6 == 0) {
    stbi__g_failure_reason = pcVar22;
    return 0;
  }
  pbVar11 = s->img_buffer;
  if (s->img_buffer_end <= pbVar11) {
    if (s->read_from_callbacks == 0) {
      bVar3 = 0;
      goto LAB_00112dfe;
    }
    psVar10 = s->buffer_start;
    iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
    if (iVar5 == 0) {
      s->read_from_callbacks = 0;
      s->img_buffer = psVar10;
      s->img_buffer_end = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      s->img_buffer = psVar10;
      s->img_buffer_end = psVar10 + iVar5;
    }
    pbVar11 = s->img_buffer;
  }
  s->img_buffer = pbVar11 + 1;
  bVar3 = *pbVar11;
LAB_00112dfe:
  if ((bVar3 & 0xfd) != 1) {
    stbi__g_failure_reason = pcVar22;
    return 0;
  }
  uVar7 = (uint)bVar3;
  s->img_n = uVar7;
  if (uVar7 != 0) {
    lVar16 = 0;
    do {
      *(undefined8 *)((long)&z->img_comp[0].data + lVar16) = 0;
      *(undefined8 *)((long)&z->img_comp[0].linebuf + lVar16) = 0;
      lVar16 = lVar16 + 0x60;
    } while ((ulong)bVar3 * 0x60 != lVar16);
  }
  if (uVar4 != uVar7 * 3 + 8) {
    stbi__g_failure_reason = pcVar22;
    return 0;
  }
  psVar10 = s->buffer_start;
  psVar1 = s->buffer_start + 1;
  piVar23 = &z->img_comp[0].tq;
  uVar17 = 0;
  do {
    uVar4 = s->img_n;
    lVar16 = (long)(int)uVar4;
    if (lVar16 <= (long)uVar17) {
      if (scan != 0) {
        return 1;
      }
      uVar7 = s->img_x;
      uVar2 = s->img_y;
      if ((uint)((0x40000000 / (ulong)uVar7) / (ulong)uVar4) < uVar2) {
        stbi__g_failure_reason = "Image too large to decode";
        return 0;
      }
      uVar19 = 1;
      uVar17 = 1;
      if (0 < (int)uVar4) {
        uVar17 = 1;
        lVar14 = 0;
        uVar19 = 1;
        do {
          uVar8 = *(uint *)((long)&z->img_comp[0].h + lVar14);
          uVar9 = *(uint *)((long)&z->img_comp[0].v + lVar14);
          if ((int)uVar19 < (int)uVar8) {
            uVar19 = (ulong)uVar8;
          }
          if ((int)uVar17 < (int)uVar9) {
            uVar17 = (ulong)uVar9;
          }
          lVar14 = lVar14 + 0x60;
        } while (lVar16 * 0x60 != lVar14);
      }
      iVar18 = (int)uVar19;
      z->img_h_max = iVar18;
      iVar5 = (int)uVar17;
      z->img_v_max = iVar5;
      z->img_mcu_w = iVar18 * 8;
      z->img_mcu_h = iVar5 * 8;
      uVar8 = ((uVar7 + iVar18 * 8) - 1) / (uint)(iVar18 * 8);
      z->img_mcu_x = uVar8;
      uVar9 = ((uVar2 + iVar5 * 8) - 1) / (uint)(iVar5 * 8);
      z->img_mcu_y = uVar9;
      if (0 < (int)uVar4) {
        piVar23 = &z->img_comp[0].coeff_h;
        lVar14 = 1;
        do {
          piVar23[-0x10] = (int)((piVar23[-0x16] * uVar7 + iVar18 + -1) / uVar19);
          piVar23[-0xf] = (int)((piVar23[-0x15] * uVar2 + iVar5 + -1) / uVar17);
          iVar21 = piVar23[-0x16] * uVar8;
          piVar23[-0xe] = iVar21 * 8;
          iVar20 = piVar23[-0x15] * uVar9;
          piVar23[-0xd] = iVar20 * 8;
          pvVar12 = malloc((long)(int)(iVar20 * 8 * iVar21 * 8 | 0xf));
          *(void **)(piVar23 + -9) = pvVar12;
          if (pvVar12 == (void *)0x0) {
            if (lVar14 == 1) {
              stbi__g_failure_reason = "Out of memory";
              return 0;
            }
            do {
              uVar4 = (int)lVar14 - 2;
              free(z->img_comp[uVar4].raw_data);
              z->img_comp[uVar4].data = (stbi_uc *)0x0;
              lVar14 = lVar14 + -1;
            } while (1 < lVar14);
            stbi__g_failure_reason = "Out of memory";
            return 0;
          }
          *(stbi_uc **)(piVar23 + -0xb) = (stbi_uc *)((long)pvVar12 + 0xfU & 0xfffffffffffffff0);
          *(stbi_uc **)(piVar23 + -5) = (stbi_uc *)0x0;
          if (z->progressive == 0) {
            *(short **)(piVar23 + -3) = (short *)0x0;
            lVar15 = 0x40;
            uVar13 = 0;
          }
          else {
            piVar23[-1] = iVar21;
            *piVar23 = iVar20;
            pvVar12 = malloc((long)(iVar21 * iVar20 * 0x40) * 2 + 0xf);
            *(void **)(piVar23 + -7) = pvVar12;
            uVar13 = (long)pvVar12 + 0xfU & 0xfffffffffffffff0;
            lVar15 = 0x50;
          }
          *(ulong *)((long)piVar23 + lVar15 + -0x5c) = uVar13;
          piVar23 = piVar23 + 0x18;
          bVar24 = lVar14 != lVar16;
          lVar14 = lVar14 + 1;
        } while (bVar24);
        return 1;
      }
      return 1;
    }
    pbVar11 = s->img_buffer;
    if (pbVar11 < s->img_buffer_end) {
LAB_00112ee1:
      s->img_buffer = pbVar11 + 1;
      bVar3 = *pbVar11;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
        if (iVar5 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar10;
          s->img_buffer_end = psVar1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar10;
          s->img_buffer_end = psVar10 + iVar5;
        }
        pbVar11 = s->img_buffer;
        goto LAB_00112ee1;
      }
      bVar3 = 0;
    }
    ((anon_struct_96_18_0d0905d3 *)(piVar23 + -3))->id = (uint)bVar3;
    if (uVar17 + 1 != (ulong)bVar3 && uVar17 != bVar3) {
      stbi__g_failure_reason = pcVar22;
      return 0;
    }
    pbVar11 = s->img_buffer;
    if (pbVar11 < s->img_buffer_end) {
LAB_00112f7b:
      s->img_buffer = pbVar11 + 1;
      bVar3 = *pbVar11;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
        if (iVar5 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar10;
          s->img_buffer_end = psVar1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar10;
          s->img_buffer_end = psVar10 + iVar5;
        }
        pbVar11 = s->img_buffer;
        goto LAB_00112f7b;
      }
      bVar3 = 0;
    }
    piVar23[-2] = (uint)(bVar3 >> 4);
    if ((byte)(bVar3 + 0xb0) < 0xc0) {
      stbi__g_failure_reason = pcVar22;
      return 0;
    }
    piVar23[-1] = bVar3 & 0xf;
    if ((bVar3 & 0xf) - 5 < 0xfffffffc) {
      stbi__g_failure_reason = pcVar22;
      return 0;
    }
    pbVar11 = s->img_buffer;
    if (pbVar11 < s->img_buffer_end) {
LAB_00113020:
      s->img_buffer = pbVar11 + 1;
      bVar3 = *pbVar11;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar5 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
        if (iVar5 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar10;
          s->img_buffer_end = psVar1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar10;
          s->img_buffer_end = psVar10 + iVar5;
        }
        pbVar11 = s->img_buffer;
        goto LAB_00113020;
      }
      bVar3 = 0;
    }
    *piVar23 = (uint)bVar3;
    piVar23 = piVar23 + 0x18;
    uVar17 = uVar17 + 1;
    if (3 < bVar3) {
      stbi__g_failure_reason = pcVar22;
      return 0;
    }
  } while( true );
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1) return stbi__err("bad component count","Corrupt JPEG");    // JFIF requires
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   for (i=0; i < s->img_n; ++i) {
      z->img_comp[i].id = stbi__get8(s);
      if (z->img_comp[i].id != i+1)   // JFIF requires
         if (z->img_comp[i].id != i)  // some version of jpegtran outputs non-JFIF-compliant files!
            return stbi__err("bad component ID","Corrupt JPEG");
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].raw_data = stbi__malloc(z->img_comp[i].w2 * z->img_comp[i].h2+15);

      if (z->img_comp[i].raw_data == NULL) {
         for(--i; i >= 0; --i) {
            STBI_FREE(z->img_comp[i].raw_data);
            z->img_comp[i].data = NULL;
         }
         return stbi__err("outofmem", "Out of memory");
      }
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      z->img_comp[i].linebuf = NULL;
      if (z->progressive) {
         z->img_comp[i].coeff_w = (z->img_comp[i].w2 + 7) >> 3;
         z->img_comp[i].coeff_h = (z->img_comp[i].h2 + 7) >> 3;
         z->img_comp[i].raw_coeff = STBI_MALLOC(z->img_comp[i].coeff_w * z->img_comp[i].coeff_h * 64 * sizeof(short) + 15);
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      } else {
         z->img_comp[i].coeff = 0;
         z->img_comp[i].raw_coeff = 0;
      }
   }

   return 1;
}